

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,wchar_t wideChar)

{
  wchar_t in_ESI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  Utf<32U>::decodeWide<wchar_t>(in_ESI);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(in_RDI,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

String::String(wchar_t wideChar)
{
    m_string += Utf32::decodeWide(wideChar);
}